

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

void HD4_C(uint8_t *dst)

{
  uint8_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int C;
  int B;
  int A;
  int X;
  int L;
  int K;
  int J;
  int I;
  uint8_t *dst_local;
  
  uVar2 = (uint)dst[-1];
  uVar3 = (uint)dst[0x1f];
  uVar4 = (uint)dst[0x3f];
  uVar5 = (uint)dst[-0x21];
  uVar6 = (uint)dst[-0x20];
  uVar1 = (uint8_t)((int)(uVar2 + uVar5 + 1) >> 1);
  dst[0x22] = uVar1;
  *dst = uVar1;
  uVar1 = (uint8_t)((int)(uVar3 + uVar2 + 1) >> 1);
  dst[0x42] = uVar1;
  dst[0x20] = uVar1;
  uVar1 = (uint8_t)((int)(uVar4 + uVar3 + 1) >> 1);
  dst[0x62] = uVar1;
  dst[0x40] = uVar1;
  dst[0x60] = (uint8_t)((int)(dst[0x5f] + uVar4 + 1) >> 1);
  dst[3] = (uint8_t)((int)(uVar6 + (uint)dst[-0x1f] * 2 + (uint)dst[-0x1e] + 2) >> 2);
  dst[2] = (uint8_t)((int)(uVar5 + uVar6 * 2 + (uint)dst[-0x1f] + 2) >> 2);
  uVar1 = (uint8_t)((int)(uVar2 + uVar5 * 2 + uVar6 + 2) >> 2);
  dst[0x23] = uVar1;
  dst[1] = uVar1;
  uVar1 = (uint8_t)((int)(uVar3 + uVar2 * 2 + uVar5 + 2) >> 2);
  dst[0x43] = uVar1;
  dst[0x21] = uVar1;
  uVar1 = (uint8_t)((int)(uVar4 + uVar3 * 2 + uVar2 + 2) >> 2);
  dst[99] = uVar1;
  dst[0x41] = uVar1;
  dst[0x61] = (uint8_t)((int)((uint)dst[0x5f] + uVar4 * 2 + uVar3 + 2) >> 2);
  return;
}

Assistant:

static void HD4_C(uint8_t* dst) {  // Horizontal-Down
  const int I = dst[-1 + 0 * BPS];
  const int J = dst[-1 + 1 * BPS];
  const int K = dst[-1 + 2 * BPS];
  const int L = dst[-1 + 3 * BPS];
  const int X = dst[-1 - BPS];
  const int A = dst[0 - BPS];
  const int B = dst[1 - BPS];
  const int C = dst[2 - BPS];

  DST(0, 0) = DST(2, 1) = AVG2(I, X);
  DST(0, 1) = DST(2, 2) = AVG2(J, I);
  DST(0, 2) = DST(2, 3) = AVG2(K, J);
  DST(0, 3)             = AVG2(L, K);

  DST(3, 0)             = AVG3(A, B, C);
  DST(2, 0)             = AVG3(X, A, B);
  DST(1, 0) = DST(3, 1) = AVG3(I, X, A);
  DST(1, 1) = DST(3, 2) = AVG3(J, I, X);
  DST(1, 2) = DST(3, 3) = AVG3(K, J, I);
  DST(1, 3)             = AVG3(L, K, J);
}